

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
* __thiscall
ezy::features::result_interface<ezy::features::optional_adapter>::
impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
::
map_error<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__11_const&>
          (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,
          impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
          *this,anon_class_1_0_00000001 *fn_err)

{
  int *piVar1;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined1 local_18;
  
  if (this[4] ==
      (impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
       )0x1) {
    piVar1 = optional_adapter<std::optional<int>>::get_success<std::optional<int>const&>
                       ((optional<int> *)this);
    local_38._M_first._M_storage = (_Uninitialized<int,_true>)*piVar1;
    local_18 = 0;
  }
  else {
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,char_const*>((_Variant_storage<false,int,std::__cxx11::string> *)&local_38)
    ;
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_38._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) map_error(FnErr&& fn_err) const &
      {
        return _impl::template map_error<Ret>(static_cast<const T&>(*this), std::forward<FnErr>(fn_err));
      }